

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBlockCommand.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_565d99::cmBlockFunctionBlocker::Replay
          (cmBlockFunctionBlocker *this,
          vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions,
          cmExecutionStatus *inStatus)

{
  pointer lff;
  bool bVar1;
  cmMakefile *makefile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  undefined1 local_98 [8];
  cmExecutionStatus status;
  cmListFileFunction *fn;
  iterator __end1;
  iterator __begin1;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *__range1;
  cmMakefile *mf;
  cmExecutionStatus *inStatus_local;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions_local;
  cmBlockFunctionBlocker *this_local;
  
  makefile = cmExecutionStatus::GetMakefile(inStatus);
  __end1 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin(functions);
  fn = (cmListFileFunction *)
       std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end(functions);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                                     *)&fn), bVar1) {
    status.Variables.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                  ::operator*(&__end1);
    cmExecutionStatus::cmExecutionStatus((cmExecutionStatus *)local_98,makefile);
    lff = status.Variables.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(&local_c0);
    cmMakefile::ExecuteCommand
              (makefile,(cmListFileFunction *)lff,(cmExecutionStatus *)local_98,&local_c0);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_c0);
    bVar1 = cmExecutionStatus::GetReturnInvoked((cmExecutionStatus *)local_98);
    if (bVar1) {
      pvVar2 = cmExecutionStatus::GetReturnVariables_abi_cxx11_((cmExecutionStatus *)local_98);
      cmMakefile::RaiseScope(makefile,pvVar2);
      pvVar2 = cmExecutionStatus::GetReturnVariables_abi_cxx11_((cmExecutionStatus *)local_98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_e8,pvVar2);
      cmExecutionStatus::SetReturnInvoked(inStatus,&local_e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_e8);
      this_local._7_1_ = 1;
      bVar1 = true;
    }
    else {
      bVar1 = cmExecutionStatus::GetBreakInvoked((cmExecutionStatus *)local_98);
      if (bVar1) {
        cmExecutionStatus::SetBreakInvoked(inStatus);
        this_local._7_1_ = 1;
        bVar1 = true;
      }
      else {
        bVar1 = cmExecutionStatus::GetContinueInvoked((cmExecutionStatus *)local_98);
        if (bVar1) {
          cmExecutionStatus::SetContinueInvoked(inStatus);
          this_local._7_1_ = 1;
          bVar1 = true;
        }
        else {
          bVar1 = cmSystemTools::GetFatalErrorOccurred();
          if (bVar1) {
            this_local._7_1_ = 1;
            bVar1 = true;
          }
          else {
            bVar1 = false;
          }
        }
      }
    }
    cmExecutionStatus::~cmExecutionStatus((cmExecutionStatus *)local_98);
    if (bVar1) goto LAB_003f6525;
    __gnu_cxx::
    __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
    ::operator++(&__end1);
  }
  this_local._7_1_ = 1;
LAB_003f6525:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmBlockFunctionBlocker::Replay(std::vector<cmListFileFunction> functions,
                                    cmExecutionStatus& inStatus)
{
  auto& mf = inStatus.GetMakefile();

  // Invoke all the functions that were collected in the block.
  for (cmListFileFunction const& fn : functions) {
    cmExecutionStatus status(mf);
    mf.ExecuteCommand(fn, status);
    if (status.GetReturnInvoked()) {
      mf.RaiseScope(status.GetReturnVariables());
      inStatus.SetReturnInvoked(status.GetReturnVariables());
      return true;
    }
    if (status.GetBreakInvoked()) {
      inStatus.SetBreakInvoked();
      return true;
    }
    if (status.GetContinueInvoked()) {
      inStatus.SetContinueInvoked();
      return true;
    }
    if (cmSystemTools::GetFatalErrorOccurred()) {
      return true;
    }
  }
  return true;
}